

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

PostDominatorAnalysis * __thiscall
spvtools::opt::IRContext::GetPostDominatorAnalysis(IRContext *this,Function *f)

{
  _Rb_tree_header *p_Var1;
  DominatorTree *this_00;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  Function *local_20;
  
  local_20 = f;
  if ((this->valid_analyses_ & kAnalysisDominatorAnalysis) == kAnalysisNone) {
    ResetDominatorAnalysis(this);
  }
  p_Var1 = &(this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0;
      p_Var4 = (&p_Var4->_M_left)[*(Function **)(p_Var4 + 1) < local_20]) {
    if (*(Function **)(p_Var4 + 1) >= local_20) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = p_Var3, local_20 < *(Function **)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    this_00 = (DominatorTree *)
              std::
              map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
              ::operator[](&this->post_dominator_trees_,&local_20);
    if ((this->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      BuildCFG(this);
    }
    DominatorTree::InitializeTree
              (this_00,(this->cfg_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                       .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,local_20);
  }
  pmVar2 = std::
           map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
           ::operator[](&this->post_dominator_trees_,&local_20);
  return pmVar2;
}

Assistant:

PostDominatorAnalysis* IRContext::GetPostDominatorAnalysis(const Function* f) {
  if (!AreAnalysesValid(kAnalysisDominatorAnalysis)) {
    ResetDominatorAnalysis();
  }

  if (post_dominator_trees_.find(f) == post_dominator_trees_.end()) {
    post_dominator_trees_[f].InitializeTree(*cfg(), f);
  }

  return &post_dominator_trees_[f];
}